

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O3

void __thiscall QpVector::sanitize(QpVector *this,double threshold)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (this->num_nz < 1) {
    iVar4 = 0;
  }
  else {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar1 = piVar2[lVar5];
      if (ABS(pdVar3[iVar1]) <= threshold) {
        pdVar3[iVar1] = 0.0;
        piVar2[lVar5] = 0;
      }
      else {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        piVar2[lVar6] = iVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->num_nz);
  }
  this->num_nz = iVar4;
  return;
}

Assistant:

void sanitize(double threshold = 1e-14) {
    HighsInt new_idx = 0;

    for (HighsInt i = 0; i < num_nz; i++) {
      if (fabs(value[index[i]]) > threshold) {
        index[new_idx++] = index[i];
      } else {
        value[index[i]] = 0.0;
        index[i] = 0;
      }
    }
    num_nz = new_idx;
  }